

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

bool __thiscall tchecker::clockbounds::df_solver_t::solve(df_solver_t *this,local_lu_map_t *map)

{
  clock_id_t cVar1;
  loc_id_t lVar2;
  bool bVar3;
  clock_id_t cVar4;
  loc_id_t lVar5;
  bound_t bVar6;
  invalid_argument *piVar7;
  map_t *pmVar8;
  int *piVar9;
  uint local_38;
  uint local_34;
  clock_id_t clock;
  loc_id_t loc;
  bool consistent;
  local_lu_map_t *map_local;
  df_solver_t *this_local;
  
  cVar1 = this->_clock_number;
  cVar4 = local_lu_map_t::clock_number(map);
  if (cVar1 != cVar4) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"*** solve: invalid number of clocks");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar2 = this->_loc_number;
  lVar5 = local_lu_map_t::loc_number(map);
  if (lVar2 != lVar5) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"*** solve: invalid number of locations");
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  bVar3 = ensure_tight(this);
  if (bVar3) {
    for (local_34 = 0; local_34 < this->_loc_number; local_34 = local_34 + 1) {
      for (local_38 = 0; local_38 < this->_clock_number; local_38 = local_38 + 1) {
        bVar6 = L(this,local_34,local_38);
        pmVar8 = local_lu_map_t::L(map,local_34);
        piVar9 = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::operator[]
                           (pmVar8,local_38);
        *piVar9 = bVar6;
        bVar6 = U(this,local_34,local_38);
        pmVar8 = local_lu_map_t::U(map,local_34);
        piVar9 = make_array_t<int,_4UL,_tchecker::array_capacity_t<unsigned_int>_>::operator[]
                           (pmVar8,local_38);
        *piVar9 = bVar6;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool df_solver_t::solve(tchecker::clockbounds::local_lu_map_t & map)
{
  if (_clock_number != map.clock_number())
    throw std::invalid_argument("*** solve: invalid number of clocks");
  if (_loc_number != map.loc_number())
    throw std::invalid_argument("*** solve: invalid number of locations");

  bool consistent = ensure_tight();
  if (!consistent)
    return false;

  for (tchecker::loc_id_t loc = 0; loc < _loc_number; ++loc)
    for (tchecker::clock_id_t clock = 0; clock < _clock_number; ++clock) {
      map.L(loc)[clock] = L(loc, clock);
      map.U(loc)[clock] = U(loc, clock);
    }

  return true;
}